

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_WheelDD::RS_WheelDD
          (RS_WheelDD *this,string *name,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system)

{
  ChSystem *pCVar1;
  element_type *peVar2;
  ChColor local_1fc;
  ChVector<double> local_1f0;
  ChQuaternion<double> local_1d8;
  ChVector<double> local_1b8;
  CylinderShape local_1a0;
  shared_ptr<chrono::ChPhysicsItem> local_158;
  ChQuaternion<double> local_148;
  ChFrame<double> local_128;
  undefined1 local_a0 [8];
  ChVector<double> inertia_xy;
  ChVector<double> inertia_xx;
  ChVector<double> com;
  double mass;
  shared_ptr<chrono::ChMaterialSurface> local_40;
  ChSystem *local_30;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *psStack_18;
  int id_local;
  string *name_local;
  RS_WheelDD *this_local;
  
  local_30 = system;
  system_local = (ChSystem *)mat;
  mat_local._4_4_ = id;
  psStack_18 = name;
  name_local = (string *)this;
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&local_40,mat);
  RS_Part::RS_Part(&this->super_RS_Part,name,&local_40,local_30);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_40);
  (this->super_RS_Part)._vptr_RS_Part = (_func_int **)&PTR__RS_WheelDD_002ed8e0;
  ChVector<double>::ChVector((ChVector<double> *)(inertia_xx.m_data + 2),0.0,0.0,0.0);
  ChVector<double>::ChVector((ChVector<double> *)(inertia_xy.m_data + 2),0.01,0.01,0.02);
  ChVector<double>::ChVector((ChVector<double> *)local_a0,0.0,0.0,0.0);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChObj::SetIdentifier((ChObj *)peVar2,mat_local._4_4_);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChBody::SetMass((ChBody *)peVar2,3.4925);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  ChQuaternion<double>::ChQuaternion(&local_148,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&local_128,(ChVector<double> *)(inertia_xx.m_data + 2),&local_148);
  chrono::ChBodyAuxRef::SetFrame_COG_to_REF((ChFrame *)peVar2);
  ChFrame<double>::~ChFrame(&local_128);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXX(peVar2);
  peVar2 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_RS_Part).m_body);
  chrono::ChBody::SetInertiaXY(peVar2);
  pCVar1 = local_30;
  std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChBodyAuxRef,void>
            (&local_158,&(this->super_RS_Part).m_body);
  chrono::ChSystem::Add(pCVar1,&local_158);
  std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_158);
  ChVector<double>::ChVector(&local_1b8,0.0,0.0,0.0);
  chrono::Q_from_AngX(1.5707963267948966);
  CylinderShape::CylinderShape(&local_1a0,&local_1b8,&local_1d8,0.074,0.038);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::push_back(&(this->super_RS_Part).m_cylinders,&local_1a0);
  std::__cxx11::string::operator=((string *)&(this->super_RS_Part).m_mesh_name,"robosim_dd_wheel");
  ChVector<double>::ChVector(&local_1f0,0.0,0.0,0.0);
  ChVector<double>::operator=(&(this->super_RS_Part).m_offset,&local_1f0);
  ChColor::ChColor(&local_1fc,0.3,0.3,0.3);
  ChColor::operator=(&(this->super_RS_Part).m_color,&local_1fc);
  return;
}

Assistant:

RS_WheelDD::RS_WheelDD(const std::string& name, int id, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : RS_Part(name, mat, system) {
    double mass = 3.492500;
    ChVector<> com(0, 0, 0);
    ChVector<> inertia_xx(0.01, 0.01, 0.02);
    ChVector<> inertia_xy(0, 0, 0);

    m_body->SetIdentifier(id);
    m_body->SetMass(mass);
    m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
    m_body->SetInertiaXX(inertia_xx);
    m_body->SetInertiaXY(inertia_xy);
    system->Add(m_body);

    m_cylinders.push_back(CylinderShape(ChVector<>(0, 0, 0), Q_from_AngX(CH_C_PI_2), 0.074, 0.038));

    m_mesh_name = "robosim_dd_wheel";
    m_offset = ChVector<>(0, 0, 0);
    m_color = ChColor(0.3f, 0.3f, 0.3f);
}